

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  CommentInfo *pCVar1;
  CommentInfo *this_01;
  uint uVar2;
  Value *this_local;
  
  uVar2 = (uint)(ushort)(byte)this->field_0x8;
  if (3 < (byte)this->field_0x8) {
    if (uVar2 == 4) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0) {
        releasePrefixedStringValue((this->value_).string_);
      }
    }
    else if (uVar2 != 5) {
      if (1 < uVar2 - 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                      ,0xb5c,"Json::Value::~Value()");
      }
      this_00 = (this->value_).map_;
      if (this_00 !=
          (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x0) {
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~map(this_00);
        operator_delete(this_00);
      }
    }
  }
  if ((this->comments_ != (CommentInfo *)0x0) &&
     (pCVar1 = this->comments_, pCVar1 != (CommentInfo *)0x0)) {
    this_01 = pCVar1 + (long)pCVar1[-1].comment_;
    while (pCVar1 != this_01) {
      this_01 = this_01 + -1;
      CommentInfo::~CommentInfo(this_01);
    }
    operator_delete__(pCVar1 + -1);
  }
  (this->value_).int_ = 0;
  return;
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  if (comments_)
    delete[] comments_;

  value_.uint_ = 0;
}